

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void set_text_leaf_parts(Am_Object *obj,Am_Style *new_style)

{
  bool bVar1;
  Am_Wrapper *value;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Object part;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value_List parts;
  
  Am_Object::Am_Object(&local_38,&Am_Text);
  bVar1 = Am_Object::Is_Instance_Of(obj,&local_38);
  Am_Object::~Am_Object(&local_38);
  if (bVar1) {
    value = Am_Style::operator_cast_to_Am_Wrapper_(new_style);
    Am_Object::Set(obj,0x6a,value,0);
  }
  else {
    Am_Object::Am_Object(&local_40,&Am_Group);
    bVar1 = Am_Object::Is_Instance_Of(obj,&local_40);
    Am_Object::~Am_Object(&local_40);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar3 = std::operator<<(poVar3,"Bad part ");
      poVar3 = operator<<(poVar3,obj);
      std::endl<char,std::char_traits<char>>(poVar3);
      Am_Error();
    }
    pAVar2 = Am_Object::Get(obj,0x82,0);
    Am_Value_List::Am_Value_List(&parts,pAVar2);
    part.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&parts);
    while( true ) {
      bVar1 = Am_Value_List::Last(&parts);
      if (bVar1) break;
      pAVar2 = Am_Value_List::Get(&parts);
      Am_Object::operator=(&part,pAVar2);
      set_text_leaf_parts(&part,new_style);
      Am_Value_List::Next(&parts);
    }
    Am_Object::~Am_Object(&part);
    Am_Value_List::~Am_Value_List(&parts);
  }
  return;
}

Assistant:

void
set_text_leaf_parts(Am_Object &obj, Am_Style &new_style)
{
  if (obj.Is_Instance_Of(Am_Text)) {
    obj.Set(Am_FILL_STYLE, new_style);
  } else if (obj.Is_Instance_Of(Am_Group)) {
    Am_Value_List parts = obj.Get(Am_GRAPHICAL_PARTS);
    Am_Object part;
    for (parts.Start(); !parts.Last(); parts.Next()) {
      part = parts.Get();
      set_text_leaf_parts(part, new_style);
    }
  } else
    Am_ERROR("Bad part " << obj);
}